

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

void __thiscall RealCommandRunner::RealCommandRunner(RealCommandRunner *this,BuildConfig *config)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TokenPool *pTVar3;
  
  (this->super_CommandRunner)._vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_001388a0;
  this->config_ = config;
  SubprocessSet::SubprocessSet(&this->subprocs_);
  p_Var1 = &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->max_load_average_ = *(double *)(config + 0x18);
  pTVar3 = TokenPool::Get();
  this->tokens_ = pTVar3;
  if (pTVar3 != (TokenPool *)0x0) {
    iVar2 = (*pTVar3->_vptr_TokenPool[6])
                      (pTVar3,(ulong)(byte)this->config_[0xc],(ulong)(*(int *)this->config_ == 3),
                       &this->max_load_average_);
    if ((char)iVar2 == '\0') {
      if (this->tokens_ != (TokenPool *)0x0) {
        (*this->tokens_->_vptr_TokenPool[1])();
      }
      this->tokens_ = (TokenPool *)0x0;
    }
  }
  return;
}

Assistant:

RealCommandRunner::RealCommandRunner(const BuildConfig& config) : config_(config) {
  max_load_average_ = config.max_load_average;
  if ((tokens_ = TokenPool::Get()) != NULL) {
    if (!tokens_->Setup(config_.parallelism_from_cmdline,
                        config_.verbosity == BuildConfig::VERBOSE,
                        max_load_average_)) {
      delete tokens_;
      tokens_ = NULL;
    }
  }
}